

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_ApproximateOffsetOfPlain::_Run(_Test_ApproximateOffsetOfPlain *this)

{
  bool bVar1;
  Comparator *cmp;
  uint64_t uVar2;
  Slice local_15c8;
  Tester local_15b8;
  Slice local_1418;
  Tester local_1408;
  Slice local_1268;
  Tester local_1258;
  Slice local_10b8;
  Tester local_10a8;
  Slice local_f08;
  Tester local_ef8;
  Slice local_d58;
  Tester local_d48;
  Slice local_ba8;
  Tester local_b98;
  Slice local_9f8;
  Tester local_9e8;
  Slice local_848;
  Tester local_838;
  Slice local_698;
  Tester local_688;
  Slice local_4e8;
  Tester local_4d8;
  undefined1 local_338 [8];
  Options options;
  KVMap kvmap;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  string local_288 [32];
  Slice local_268;
  allocator local_251;
  string local_250 [32];
  Slice local_230;
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  Slice local_1d0;
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [32];
  Slice local_170;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  Slice local_110;
  allocator local_f9;
  string local_f8 [32];
  Slice local_d8;
  allocator local_c1;
  string local_c0 [32];
  Slice local_a0 [2];
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  TableConstructor c;
  _Test_ApproximateOffsetOfPlain *this_local;
  
  c.table_ = (Table *)this;
  cmp = BytewiseComparator();
  TableConstructor::TableConstructor((TableConstructor *)local_58,cmp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"k01",&local_79);
  Slice::Slice(local_a0,"hello");
  Constructor::Add((Constructor *)local_58,(string *)local_78,local_a0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"k02",&local_c1);
  Slice::Slice(&local_d8,"hello2");
  Constructor::Add((Constructor *)local_58,(string *)local_c0,&local_d8);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"k03",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,10000,'x',&local_131);
  Slice::Slice(&local_110,(string *)local_130);
  Constructor::Add((Constructor *)local_58,(string *)local_f8,&local_110);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"k04",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,200000,'x',&local_191);
  Slice::Slice(&local_170,(string *)local_190);
  Constructor::Add((Constructor *)local_58,(string *)local_158,&local_170);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"k05",&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,300000,'x',&local_1f1);
  Slice::Slice(&local_1d0,(string *)local_1f0);
  Constructor::Add((Constructor *)local_58,(string *)local_1b8,&local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"k06",&local_219);
  Slice::Slice(&local_230,"hello3");
  Constructor::Add((Constructor *)local_58,(string *)local_218,&local_230);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"k07",&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_288,100000,'x',
             (allocator *)
             ((long)&keys.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Slice::Slice(&local_268,(string *)local_288);
  Constructor::Add((Constructor *)local_58,(string *)local_250,&local_268);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&keys.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&kvmap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&options.filter_policy);
  Options::Options((Options *)local_338);
  options.block_cache = (Cache *)0x400;
  options.max_file_size._0_4_ = 0;
  Constructor::Finish((Constructor *)local_58,(Options *)local_338,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&kvmap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (KVMap *)&options.filter_policy);
  test::Tester::Tester
            (&local_4d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x30a);
  Slice::Slice(&local_4e8,"abc");
  uVar2 = TableConstructor::ApproximateOffsetOf((TableConstructor *)local_58,&local_4e8);
  bVar1 = Between(uVar2,0,0);
  test::Tester::Is(&local_4d8,bVar1,"Between(c.ApproximateOffsetOf(\"abc\"), 0, 0)");
  test::Tester::~Tester(&local_4d8);
  test::Tester::Tester
            (&local_688,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x30b);
  Slice::Slice(&local_698,"k01");
  uVar2 = TableConstructor::ApproximateOffsetOf((TableConstructor *)local_58,&local_698);
  bVar1 = Between(uVar2,0,0);
  test::Tester::Is(&local_688,bVar1,"Between(c.ApproximateOffsetOf(\"k01\"), 0, 0)");
  test::Tester::~Tester(&local_688);
  test::Tester::Tester
            (&local_838,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x30c);
  Slice::Slice(&local_848,"k01a");
  uVar2 = TableConstructor::ApproximateOffsetOf((TableConstructor *)local_58,&local_848);
  bVar1 = Between(uVar2,0,0);
  test::Tester::Is(&local_838,bVar1,"Between(c.ApproximateOffsetOf(\"k01a\"), 0, 0)");
  test::Tester::~Tester(&local_838);
  test::Tester::Tester
            (&local_9e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x30d);
  Slice::Slice(&local_9f8,"k02");
  uVar2 = TableConstructor::ApproximateOffsetOf((TableConstructor *)local_58,&local_9f8);
  bVar1 = Between(uVar2,0,0);
  test::Tester::Is(&local_9e8,bVar1,"Between(c.ApproximateOffsetOf(\"k02\"), 0, 0)");
  test::Tester::~Tester(&local_9e8);
  test::Tester::Tester
            (&local_b98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x30e);
  Slice::Slice(&local_ba8,"k03");
  uVar2 = TableConstructor::ApproximateOffsetOf((TableConstructor *)local_58,&local_ba8);
  bVar1 = Between(uVar2,0,0);
  test::Tester::Is(&local_b98,bVar1,"Between(c.ApproximateOffsetOf(\"k03\"), 0, 0)");
  test::Tester::~Tester(&local_b98);
  test::Tester::Tester
            (&local_d48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x30f);
  Slice::Slice(&local_d58,"k04");
  uVar2 = TableConstructor::ApproximateOffsetOf((TableConstructor *)local_58,&local_d58);
  bVar1 = Between(uVar2,10000,11000);
  test::Tester::Is(&local_d48,bVar1,"Between(c.ApproximateOffsetOf(\"k04\"), 10000, 11000)");
  test::Tester::~Tester(&local_d48);
  test::Tester::Tester
            (&local_ef8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x310);
  Slice::Slice(&local_f08,"k04a");
  uVar2 = TableConstructor::ApproximateOffsetOf((TableConstructor *)local_58,&local_f08);
  bVar1 = Between(uVar2,210000,0x33838);
  test::Tester::Is(&local_ef8,bVar1,"Between(c.ApproximateOffsetOf(\"k04a\"), 210000, 211000)");
  test::Tester::~Tester(&local_ef8);
  test::Tester::Tester
            (&local_10a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x311);
  Slice::Slice(&local_10b8,"k05");
  uVar2 = TableConstructor::ApproximateOffsetOf((TableConstructor *)local_58,&local_10b8);
  bVar1 = Between(uVar2,210000,0x33838);
  test::Tester::Is(&local_10a8,bVar1,"Between(c.ApproximateOffsetOf(\"k05\"), 210000, 211000)");
  test::Tester::~Tester(&local_10a8);
  test::Tester::Tester
            (&local_1258,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x312);
  Slice::Slice(&local_1268,"k06");
  uVar2 = TableConstructor::ApproximateOffsetOf((TableConstructor *)local_58,&local_1268);
  bVar1 = Between(uVar2,510000,0x7cc18);
  test::Tester::Is(&local_1258,bVar1,"Between(c.ApproximateOffsetOf(\"k06\"), 510000, 511000)");
  test::Tester::~Tester(&local_1258);
  test::Tester::Tester
            (&local_1408,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x313);
  Slice::Slice(&local_1418,"k07");
  uVar2 = TableConstructor::ApproximateOffsetOf((TableConstructor *)local_58,&local_1418);
  bVar1 = Between(uVar2,510000,0x7cc18);
  test::Tester::Is(&local_1408,bVar1,"Between(c.ApproximateOffsetOf(\"k07\"), 510000, 511000)");
  test::Tester::~Tester(&local_1408);
  test::Tester::Tester
            (&local_15b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
             ,0x314);
  Slice::Slice(&local_15c8,"xyz");
  uVar2 = TableConstructor::ApproximateOffsetOf((TableConstructor *)local_58,&local_15c8);
  bVar1 = Between(uVar2,610000,0x956a0);
  test::Tester::Is(&local_15b8,bVar1,"Between(c.ApproximateOffsetOf(\"xyz\"), 610000, 612000)");
  test::Tester::~Tester(&local_15b8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::STLLessThan,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&options.filter_policy);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&kvmap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  TableConstructor::~TableConstructor((TableConstructor *)local_58);
  return;
}

Assistant:

TEST(TableTest, ApproximateOffsetOfPlain) {
  TableConstructor c(BytewiseComparator());
  c.Add("k01", "hello");
  c.Add("k02", "hello2");
  c.Add("k03", std::string(10000, 'x'));
  c.Add("k04", std::string(200000, 'x'));
  c.Add("k05", std::string(300000, 'x'));
  c.Add("k06", "hello3");
  c.Add("k07", std::string(100000, 'x'));
  std::vector<std::string> keys;
  KVMap kvmap;
  Options options;
  options.block_size = 1024;
  options.compression = kNoCompression;
  c.Finish(options, &keys, &kvmap);

  ASSERT_TRUE(Between(c.ApproximateOffsetOf("abc"), 0, 0));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k01"), 0, 0));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k01a"), 0, 0));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k02"), 0, 0));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k03"), 0, 0));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k04"), 10000, 11000));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k04a"), 210000, 211000));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k05"), 210000, 211000));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k06"), 510000, 511000));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("k07"), 510000, 511000));
  ASSERT_TRUE(Between(c.ApproximateOffsetOf("xyz"), 610000, 612000));
}